

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::TextFlow::Columns::iterator::iterator
          (iterator *this,
          vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_> *columns)

{
  pointer *ppcVar1;
  Column *pCVar2;
  iterator __position;
  Column *col;
  Column *pCVar3;
  const_iterator local_68;
  
  this->m_columns = columns;
  (this->m_iterators).
  super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_iterators).
  super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_iterators).
  super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_activeIterators = 0;
  std::
  vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ::reserve(&this->m_iterators,
            (long)(columns->
                  super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(columns->
                  super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 6);
  pCVar2 = (this->m_columns->
           super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pCVar3 = (this->m_columns->
                super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                )._M_impl.super__Vector_impl_data._M_start; pCVar3 != pCVar2; pCVar3 = pCVar3 + 1) {
    local_68.m_lineStart.m_it._M_current =
         (pCVar3->m_string).m_string._M_dataplus._M_p + (pCVar3->m_string).m_string._M_string_length
    ;
    local_68.m_addHyphen = false;
    __position._M_current =
         (this->m_iterators).
         super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_iterators).
        super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_68.m_column = pCVar3;
      local_68.m_lineStart.m_string = (string *)pCVar3;
      local_68.m_lineEnd.m_string = (string *)pCVar3;
      local_68.m_lineEnd.m_it._M_current = local_68.m_lineStart.m_it._M_current;
      local_68.m_parsedTo.m_string = (string *)pCVar3;
      local_68.m_parsedTo.m_it._M_current = local_68.m_lineStart.m_it._M_current;
      std::
      vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
      ::_M_realloc_insert<Catch::TextFlow::Column::const_iterator>
                (&this->m_iterators,__position,&local_68);
    }
    else {
      ((__position._M_current)->m_parsedTo).m_it._M_current = local_68.m_lineStart.m_it._M_current;
      *(ulong *)&(__position._M_current)->m_addHyphen = (ulong)(uint7)local_68._57_7_ << 8;
      ((__position._M_current)->m_lineEnd).m_it._M_current = local_68.m_lineStart.m_it._M_current;
      ((__position._M_current)->m_parsedTo).m_string = (string *)pCVar3;
      ((__position._M_current)->m_lineStart).m_it._M_current = local_68.m_lineStart.m_it._M_current;
      ((__position._M_current)->m_lineEnd).m_string = (string *)pCVar3;
      (__position._M_current)->m_column = pCVar3;
      ((__position._M_current)->m_lineStart).m_string = (string *)pCVar3;
      ppcVar1 = &(this->m_iterators).
                 super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
  }
  return;
}

Assistant:

Columns::iterator::iterator( Columns const& columns, EndTag ):
            m_columns( columns.m_columns ), m_activeIterators( 0 ) {

            m_iterators.reserve( m_columns.size() );
            for ( auto const& col : m_columns ) {
                m_iterators.push_back( col.end() );
            }
        }